

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerSettings.cpp
# Opt level: O3

bool __thiscall USBAnalyzerSettings::SetSettingsFromInterfaces(USBAnalyzerSettings *this)

{
  Channel *this_00;
  Channel *this_01;
  char cVar1;
  double dVar2;
  Channel aCStack_48 [16];
  Channel local_38 [16];
  
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::Channel(local_38,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  cVar1 = Channel::operator==(aCStack_48,local_38);
  Channel::~Channel(local_38);
  Channel::~Channel(aCStack_48);
  if (cVar1 == '\0') {
    AnalyzerSettingInterfaceChannel::GetChannel();
    Channel::Channel(local_38,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    cVar1 = Channel::operator==(aCStack_48,local_38);
    Channel::~Channel(local_38);
    Channel::~Channel(aCStack_48);
    if (cVar1 == '\0') {
      AnalyzerSettingInterfaceChannel::GetChannel();
      this_00 = &this->mDPChannel;
      Channel::operator=(this_00,aCStack_48);
      Channel::~Channel(aCStack_48);
      AnalyzerSettingInterfaceChannel::GetChannel();
      this_01 = &this->mDMChannel;
      Channel::operator=(this_01,aCStack_48);
      Channel::~Channel(aCStack_48);
      dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
      this->mSpeed = (int)dVar2;
      dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
      this->mDecodeLevel = (int)dVar2;
      cVar1 = Channel::operator==(this_01,this_00);
      if (cVar1 == '\0') {
        AnalyzerSettings::ClearChannels();
        AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
        AnalyzerSettings::AddChannel((Channel *)this,(char *)this_01,true);
        return true;
      }
    }
  }
  AnalyzerSettings::SetErrorText((char *)this);
  return false;
}

Assistant:

bool USBAnalyzerSettings::SetSettingsFromInterfaces()
{
    if( mDPChannelInterface.GetChannel() == UNDEFINED_CHANNEL )
    {
        SetErrorText( "Please select an input for the D+ channel." );
        return false;
    }

    if( mDMChannelInterface.GetChannel() == UNDEFINED_CHANNEL )
    {
        SetErrorText( "Please select an input for the D- channel." );
        return false;
    }

    mDPChannel = mDPChannelInterface.GetChannel();
    mDMChannel = mDMChannelInterface.GetChannel();
    mSpeed = USBSpeed( int( mSpeedInterface.GetNumber() ) );
    mDecodeLevel = USBDecodeLevel( int( mDecodeLevelInterface.GetNumber() ) );

    if( mDMChannel == mDPChannel )
    {
        SetErrorText( "Please select different inputs for the D- and D+ channels." );
        return false;
    }

    ClearChannels();

    AddChannel( mDPChannel, "D+", true );
    AddChannel( mDMChannel, "D-", true );

    return true;
}